

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberTemplate
          (CppTypeName *this,StringPtr innerName,
          Array<capnp::(anonymous_namespace)::CppTypeName> *params)

{
  undefined1 uVar1;
  size_t sVar2;
  char *pcVar3;
  ArrayDisposer *pAVar4;
  Branch *pBVar5;
  ArrayDisposer *pAVar6;
  undefined8 uVar7;
  StringTree *pSVar8;
  CppTypeName *params_00;
  StringPtr delim;
  Array<kj::StringTree> result;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 uVar9;
  StringTree *local_130;
  Array<kj::StringTree> local_118;
  undefined1 local_100 [16];
  char *pcStack_f0;
  ArrayDisposer *local_e8;
  Branch *pBStack_e0;
  Branch *local_d8;
  ArrayDisposer *pAStack_d0;
  ArrayDisposer *local_c8;
  StringTree local_c0;
  char *local_88;
  size_t local_80;
  undefined1 local_78 [24];
  ArrayDisposer *local_60;
  Branch *pBStack_58;
  undefined8 *local_50;
  ArrayDisposer *local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  local_80 = innerName.content.size_;
  local_88 = innerName.content.ptr;
  uVar1 = this->isArgDependent;
  this->needsTypename = (bool)uVar1;
  uVar9 = true;
  if (this->hasDisambiguatedTemplate_ == false) {
    uVar9 = uVar1;
  }
  local_100._0_8_ = "::";
  if ((bool)uVar1 != false) {
    local_100._0_8_ = "::template ";
  }
  this->hasDisambiguatedTemplate_ = (bool)uVar9;
  uVar9 = 0x3c;
  sVar2 = params->size_;
  local_118.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,sVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar8 = local_118.ptr + sVar2;
  local_130 = local_118.ptr;
  if (params->size_ != 0) {
    params_00 = params->ptr;
    do {
      if (params_00->isArgDependent == true) {
        this->isArgDependent = true;
      }
      if (params_00->hasInterfaces_ == true) {
        this->hasInterfaces_ = true;
      }
      if (params_00->hasDisambiguatedTemplate_ == true) {
        this->hasDisambiguatedTemplate_ = true;
      }
      if (params_00->needsTypename == true) {
        local_78._0_8_ = "typename ";
        local_78._8_8_ = (char *)0x9;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)(local_100 + 8),(StringTree *)local_78,
                   (ArrayPtr<const_char> *)params_00,pSVar8);
      }
      else {
        local_100._8_8_ = (params_00->name).size_;
        pcStack_f0 = (params_00->name).text.content.ptr;
        local_e8 = (ArrayDisposer *)(params_00->name).text.content.size_;
        pBStack_e0 = (Branch *)(params_00->name).text.content.disposer;
        (params_00->name).text.content.ptr = (char *)0x0;
        (params_00->name).text.content.size_ = 0;
        local_d8 = (params_00->name).branches.ptr;
        pAStack_d0 = (ArrayDisposer *)(params_00->name).branches.size_;
        local_c8 = (params_00->name).branches.disposer;
        (params_00->name).branches.ptr = (Branch *)0x0;
        (params_00->name).branches.size_ = 0;
      }
      pAVar6 = pAStack_d0;
      pBVar5 = local_d8;
      pAVar4 = local_e8;
      pcVar3 = pcStack_f0;
      pcStack_f0 = (char *)0x0;
      local_e8 = (ArrayDisposer *)0x0;
      local_d8 = (Branch *)0x0;
      pAStack_d0 = (ArrayDisposer *)0x0;
      local_130->size_ = local_100._8_8_;
      (local_130->text).content.ptr = pcVar3;
      (local_130->text).content.size_ = (size_t)pAVar4;
      (local_130->text).content.disposer = (ArrayDisposer *)pBStack_e0;
      (local_130->branches).ptr = pBVar5;
      (local_130->branches).size_ = (size_t)pAVar6;
      (local_130->branches).disposer = local_c8;
      pSVar8 = local_130 + 1;
      params_00 = params_00 + 1;
      local_130 = pSVar8;
    } while (params_00 != params->ptr + params->size_);
  }
  local_118.size_ = ((long)local_130 - (long)local_118.ptr >> 3) * 0x6db6db6db6db6db7;
  local_118.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree((StringTree *)(local_78 + 0x10),&local_118,delim);
  local_100[8] = 0x3e;
  kj::strTree<kj::StringTree,char_const*,kj::StringPtr&,char,kj::StringTree,char>
            (&local_c0,(kj *)this,(StringTree *)local_100,&local_88,
             (StringPtr *)&stack0xfffffffffffffec7,local_78 + 0x10,(StringTree *)(local_100 + 8),
             (char *)CONCAT17(uVar9,in_stack_fffffffffffffec0));
  (this->name).size_ = local_c0.size_;
  pcVar3 = (this->name).text.content.ptr;
  if (pcVar3 != (char *)0x0) {
    sVar2 = (this->name).text.content.size_;
    (this->name).text.content.ptr = (char *)0x0;
    (this->name).text.content.size_ = 0;
    pAVar4 = (this->name).text.content.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar3,1,sVar2,sVar2,0);
  }
  (this->name).text.content.ptr = local_c0.text.content.ptr;
  (this->name).text.content.size_ = local_c0.text.content.size_;
  (this->name).text.content.disposer = local_c0.text.content.disposer;
  local_c0.text.content.ptr = (char *)0x0;
  local_c0.text.content.size_ = 0;
  pBVar5 = (this->name).branches.ptr;
  if (pBVar5 != (Branch *)0x0) {
    sVar2 = (this->name).branches.size_;
    (this->name).branches.ptr = (Branch *)0x0;
    (this->name).branches.size_ = 0;
    pAVar4 = (this->name).branches.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pBVar5,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_c0.text.content.size_;
  pcVar3 = local_c0.text.content.ptr;
  (this->name).branches.ptr = local_c0.branches.ptr;
  (this->name).branches.size_ = local_c0.branches.size_;
  (this->name).branches.disposer = local_c0.branches.disposer;
  local_c0.branches.ptr = (Branch *)0x0;
  local_c0.branches.size_ = 0;
  if (local_c0.text.content.ptr != (char *)0x0) {
    local_c0.text.content.ptr = (char *)0x0;
    local_c0.text.content.size_ = 0;
    (**(local_c0.text.content.disposer)->_vptr_ArrayDisposer)
              (local_c0.text.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  uVar7 = uStack_40;
  pAVar4 = local_48;
  if (local_48 != (ArrayDisposer *)0x0) {
    local_48 = (ArrayDisposer *)0x0;
    uStack_40 = 0;
    (**(code **)*local_38)
              (local_38,pAVar4,0x40,uVar7,uVar7,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar5 = pBStack_58;
  pAVar4 = local_60;
  if (local_60 != (ArrayDisposer *)0x0) {
    local_60 = (ArrayDisposer *)0x0;
    pBStack_58 = (Branch *)0x0;
    (**(code **)*local_50)(local_50,pAVar4,1,pBVar5,pBVar5,0);
  }
  sVar2 = local_118.size_;
  pSVar8 = local_118.ptr;
  if (local_118.ptr != (StringTree *)0x0) {
    local_118.ptr = (StringTree *)0x0;
    local_118.size_ = 0;
    (**(local_118.disposer)->_vptr_ArrayDisposer)
              (local_118.disposer,pSVar8,0x38,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  return;
}

Assistant:

void addMemberTemplate(kj::StringPtr innerName, kj::Array<CppTypeName>&& params) {
    // Append "::innerName<params, ...>".
    //
    // If necessary, add the "template" disambiguation keyword in front of `innerName`.

    bool parentIsArgDependent = isArgDependent;
    needsTypename = parentIsArgDependent;
    hasDisambiguatedTemplate_ = hasDisambiguatedTemplate_ || parentIsArgDependent;

    name = kj::strTree(kj::mv(name),
        parentIsArgDependent ? "::template " : "::",
        innerName, '<',
        kj::StringTree(KJ_MAP(p, params) {
          if (p.isArgDependent) isArgDependent = true;
          if (p.hasInterfaces_) hasInterfaces_ = true;
          if (p.hasDisambiguatedTemplate_) hasDisambiguatedTemplate_ = true;
          return kj::strTree(kj::mv(p));
        }, ", "),
        '>');
  }